

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<long_long>::resize(QList<long_long> *this,qsizetype size)

{
  longlong *plVar1;
  Data *pDVar2;
  longlong *plVar3;
  long lVar4;
  
  pDVar2 = (this->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar2->super_QArrayData).alloc -
      ((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) <
      size)) {
    QArrayDataPointer<long_long>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(longlong **)0x0,
               (QArrayDataPointer<long_long> *)0x0);
    lVar4 = (this->d).size;
  }
  else {
    lVar4 = (this->d).size;
    if (size < lVar4) goto LAB_0011cb85;
  }
  if (size <= lVar4) {
    return;
  }
  plVar3 = (this->d).ptr;
  plVar1 = plVar3 + lVar4;
  *plVar1 = 0;
  if (plVar1 + 1 != plVar3 + size) {
    memset(plVar1 + 1,0,(size * 8 + lVar4 * -8) - 8);
  }
LAB_0011cb85:
  (this->d).size = size;
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }